

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void glcts::anon_unknown_0::ShaderSourceFactory::streamSubroutineDefinitions
               (vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                *subroutineUniforms,GLenum shader,ostringstream *ret)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  const_reference pvVar4;
  string *psVar5;
  const_reference pvVar6;
  UniformValue *this;
  ulong local_30;
  size_t fn;
  size_t i;
  ostringstream *ret_local;
  GLenum shader_local;
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  *subroutineUniforms_local;
  
  sVar2 = std::
          vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
          ::size(subroutineUniforms);
  if (sVar2 != 0) {
    poVar3 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                             "uniform float zero;");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  for (fn = 0; sVar2 = std::
                       vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                       ::size(subroutineUniforms), fn < sVar2; fn = fn + 1) {
    pvVar4 = std::
             vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
             ::operator[](subroutineUniforms,fn);
    bVar1 = DefOccurence::occurs(&pvVar4->defOccurence,shader);
    if (bVar1) {
      poVar3 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                               "subroutine vec4 ");
      pvVar4 = std::
               vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
               ::operator[](subroutineUniforms,fn);
      psVar5 = glcts::(anonymous_namespace)::SubroutineFunctionSet::getTypeName_abi_cxx11_
                         ((SubroutineFunctionSet *)pvVar4);
      poVar3 = std::operator<<(poVar3,(string *)psVar5);
      poVar3 = std::operator<<(poVar3,"(float param);");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      local_30 = 0;
      while( true ) {
        pvVar4 = std::
                 vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                 ::operator[](subroutineUniforms,fn);
        sVar2 = std::
                vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                ::size((vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                        *)pvVar4);
        if (sVar2 <= local_30) break;
        pvVar4 = std::
                 vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                 ::operator[](subroutineUniforms,fn);
        pvVar6 = std::
                 vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                 ::operator[]((vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                               *)pvVar4,local_30);
        LayoutSpecifier<glcts::(anonymous_namespace)::IndexSpecifier>::streamDefinition
                  (&pvVar6->index,ret,shader);
        poVar3 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                 "subroutine(");
        pvVar4 = std::
                 vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                 ::operator[](subroutineUniforms,fn);
        psVar5 = glcts::(anonymous_namespace)::SubroutineFunctionSet::getTypeName_abi_cxx11_
                           ((SubroutineFunctionSet *)pvVar4);
        poVar3 = std::operator<<(poVar3,(string *)psVar5);
        poVar3 = std::operator<<(poVar3,") vec4 ");
        pvVar4 = std::
                 vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                 ::operator[](subroutineUniforms,fn);
        pvVar6 = std::
                 vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                 ::operator[]((vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                               *)pvVar4,local_30);
        psVar5 = glcts::(anonymous_namespace)::SubroutineFunction::getName_abi_cxx11_
                           ((SubroutineFunction *)pvVar6);
        poVar3 = std::operator<<(poVar3,(string *)psVar5);
        std::operator<<(poVar3,"(float param) { return zero + ");
        pvVar4 = std::
                 vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                 ::operator[](subroutineUniforms,fn);
        pvVar6 = std::
                 vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                 ::operator[]((vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                               *)pvVar4,local_30);
        this = SubroutineFunction::getRetVal(pvVar6);
        UniformValue::streamValue(this,ret,0,0);
        poVar3 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,"; }");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        local_30 = local_30 + 1;
      }
      pvVar4 = std::
               vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
               ::operator[](subroutineUniforms,fn);
      LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::streamDefinition
                (&pvVar4->location,ret,shader);
      poVar3 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                               "subroutine uniform ");
      pvVar4 = std::
               vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
               ::operator[](subroutineUniforms,fn);
      psVar5 = glcts::(anonymous_namespace)::SubroutineFunctionSet::getTypeName_abi_cxx11_
                         ((SubroutineFunctionSet *)pvVar4);
      poVar3 = std::operator<<(poVar3,(string *)psVar5);
      poVar3 = std::operator<<(poVar3," ");
      pvVar4 = std::
               vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
               ::operator[](subroutineUniforms,fn);
      psVar5 = glcts::(anonymous_namespace)::SubroutineUniform::getName_abi_cxx11_
                         ((SubroutineUniform *)pvVar4);
      std::operator<<(poVar3,(string *)psVar5);
      pvVar4 = std::
               vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
               ::operator[](subroutineUniforms,fn);
      SubroutineUniform::streamArrayStr(pvVar4,ret,-1);
      poVar3 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,";");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

static void streamSubroutineDefinitions(const std::vector<SubroutineUniform>& subroutineUniforms, GLenum shader,
											std::ostringstream& ret)
	{
		if (subroutineUniforms.size())
		{
			//add a "zero" uniform;
			ret << "uniform float zero;" << std::endl;
		}

		for (size_t i = 0; i < subroutineUniforms.size(); i++)
		{
			if (subroutineUniforms[i].defOccurence.occurs(shader))
			{

				//subroutine vec4 st0(float param);
				ret << "subroutine vec4 " << subroutineUniforms[i].functions.getTypeName() << "(float param);"
					<< std::endl;

				for (size_t fn = 0; fn < subroutineUniforms[i].functions.fn.size(); fn++)
				{
					//layout(index = X) subroutine(st0) vec4 sf0(float param) { .... };
					subroutineUniforms[i].functions.fn[fn].index.streamDefinition(ret, shader);
					ret << "subroutine(" << subroutineUniforms[i].functions.getTypeName() << ") vec4 "
						<< subroutineUniforms[i].functions.fn[fn].getName() << "(float param) { return zero + ";
					subroutineUniforms[i].functions.fn[fn].getRetVal().streamValue(ret);
					ret << "; }" << std::endl;
				}

				//layout(location = X) subroutine uniform stX uX[...];
				subroutineUniforms[i].location.streamDefinition(ret, shader);
				ret << "subroutine uniform " << subroutineUniforms[i].functions.getTypeName() << " "
					<< subroutineUniforms[i].getName();
				subroutineUniforms[i].streamArrayStr(ret);
				ret << ";" << std::endl;
			}
		}
	}